

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Context *context;
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  JavaType type;
  mapped_type *pmVar4;
  ImmutableFieldLiteGenerator *pIVar5;
  Descriptor *pDVar6;
  Descriptor *descriptor;
  ulong uVar7;
  ulong extraout_RDX;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  ImmutableMessageLiteGenerator *field;
  AlphaNum *a_02;
  ImmutableMessageLiteGenerator *extraout_RDX_00;
  int iVar8;
  OneofDescriptor *oneof;
  int i_1;
  java *this_00;
  char *text;
  long lVar9;
  int i;
  long lVar10;
  SubstituteArg *in_stack_fffffffffffffd18;
  ImmutableMessageLiteGenerator messageGenerator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  SubstituteArg local_240;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  string local_1e0;
  string builder_type;
  SubstituteArg local_1a0;
  string local_170;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&messageGenerator,"static",(allocator *)&vars);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string((string *)&messageGenerator,"classname",(allocator *)&vars);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,
             descriptor);
  std::__cxx11::string::string((string *)&vars,"extra_interfaces",(allocator *)&local_240);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string((string *)&messageGenerator,"deprecation",(allocator *)&vars);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&messageGenerator);
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string((string *)&messageGenerator,"",(allocator *)&vars);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar6,true,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x78) < 1) {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    std::__cxx11::string::assign((char *)&builder_type);
  }
  else {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_1e0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_1a0.text_ = (char *)0x0;
    local_1a0.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_1e0._M_dataplus._M_p;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator.descriptor_._0_4_ =
         (undefined4)local_1e0._M_string_length;
    local_120.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_170,
               (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,&local_240,&local_1a0,&local_150,
               &local_60,&local_90,&local_c0,&local_f0,&local_120,in_stack_fffffffffffffd18);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  io::Printer::Indent(printer);
  GenerateConstructor(this,printer);
  lVar9 = 0;
  for (lVar10 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar10 < *(int *)(pDVar6 + 0x74); lVar10 = lVar10 + 1) {
    EnumLiteGenerator::EnumLiteGenerator
              ((EnumLiteGenerator *)&messageGenerator,
               (EnumDescriptor *)(*(long *)(pDVar6 + 0x40) + lVar9),true,this->context_);
    EnumLiteGenerator::Generate((EnumLiteGenerator *)&messageGenerator,printer);
    EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&messageGenerator);
    lVar9 = lVar9 + 0x50;
  }
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(pDVar6 + 0x70); lVar10 = lVar10 + 1) {
    if (*(char *)(*(long *)(*(long *)(pDVar6 + 0x38) + 0x20 + lVar9) + 0x4b) == '\0') {
      ImmutableMessageLiteGenerator
                (&messageGenerator,(Descriptor *)(*(long *)(pDVar6 + 0x38) + lVar9),this->context_);
      GenerateInterface(&messageGenerator,printer);
      Generate(&messageGenerator,printer);
      ~ImmutableMessageLiteGenerator(&messageGenerator);
      pDVar6 = (this->super_MessageGenerator).descriptor_;
    }
    lVar9 = lVar9 + 0x90;
  }
  lVar9 = 0;
  iVar8 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(pDVar6 + 0x68); lVar10 = lVar10 + 1) {
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar6 + 0x28) + lVar9));
    iVar3 = (*pIVar5->_vptr_ImmutableFieldLiteGenerator[2])(pIVar5);
    iVar8 = iVar8 + iVar3;
    pDVar6 = (this->super_MessageGenerator).descriptor_;
    lVar9 = lVar9 + 0x98;
  }
  iVar3 = (iVar8 + 0x1f) / 0x20;
  uVar7 = (long)(iVar8 + 0x1f) % 0x20 & 0xffffffff;
  this_00 = (java *)0x0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != (int)this_00; this_00 = (java *)(ulong)((int)this_00 + 1)) {
    GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_00,(int)uVar7);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    uVar7 = extraout_RDX;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar9 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar9 < *(int *)(pDVar6 + 0x6c); lVar9 = lVar9 + 1) {
    oneof = (OneofDescriptor *)(lVar9 * 0x30 + *(long *)(pDVar6 + 0x30));
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    std::__cxx11::string::string((string *)&messageGenerator,"oneof_name",(allocator *)&local_240);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&messageGenerator);
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    std::__cxx11::string::string
              ((string *)&messageGenerator,"oneof_capitalized_name",(allocator *)&local_240);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&messageGenerator);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)&messageGenerator,
               (int)(((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) / 0x30));
    StrCat_abi_cxx11_((string *)&local_240,(protobuf *)&messageGenerator,a);
    std::__cxx11::string::string((string *)&local_1a0,"oneof_index",(allocator *)&local_150);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_1a0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Print(printer,&vars,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,&vars,"public enum $oneof_capitalized_name$Case {\n");
    io::Printer::Indent(printer);
    for (lVar10 = 0; lVar10 < *(int *)(oneof + 0x18); lVar10 = lVar10 + 1) {
      puVar1 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar10 * 8);
      ToUpper((string *)&local_240,(string *)*puVar1);
      strings::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,*(int *)((long)puVar1 + 0x44));
      StrCat_abi_cxx11_((string *)&local_1a0,(protobuf *)&messageGenerator,a_00);
      io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,"$field_name$($field_number$),\n",(char (*) [11])0x3aba68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240,
                 (char (*) [13])"field_number",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_240);
    }
    std::__cxx11::string::string((string *)&local_240,"oneof_name",(allocator *)&local_1a0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    ToUpper((string *)&messageGenerator,pmVar4);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"$cap_oneof_name$_NOT_SET(0);\n",(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Print(printer,&vars,
                       "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                      );
    io::Printer::Print(printer,&vars,
                       "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                      );
    for (lVar10 = 0; lVar10 < *(int *)(oneof + 0x18); lVar10 = lVar10 + 1) {
      puVar1 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar10 * 8);
      strings::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,*(int *)((long)puVar1 + 0x44));
      StrCat_abi_cxx11_((string *)&local_240,(protobuf *)&messageGenerator,a_01);
      ToUpper((string *)&local_1a0,(string *)*puVar1);
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"    case $field_number$: return $field_name$;\n",
                 (char (*) [13])"field_number",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240,
                 (char (*) [11])0x3aba68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_240);
    }
    std::__cxx11::string::string((string *)&local_240,"oneof_name",(allocator *)&local_1a0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    ToUpper((string *)&messageGenerator,pmVar4);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,
               "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
               ,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"};\n\n");
    io::Printer::Print(printer,&vars,
                       "@java.lang.Override\npublic $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\nprivate void clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
                      );
  }
  lVar10 = 0;
  field = this;
  for (lVar9 = 0; lVar9 < *(int *)(pDVar6 + 0x68); lVar9 = lVar9 + 1) {
    FieldConstantName_abi_cxx11_
              ((string *)&local_240,(java *)(*(long *)(pDVar6 + 0x28) + lVar10),
               (FieldDescriptor *)field);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)&messageGenerator,
               *(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + 0x44 + lVar10
                       ));
    StrCat_abi_cxx11_((string *)&local_1a0,(protobuf *)&messageGenerator,a_02);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,"public static final int $constant_name$ = $number$;\n",
               (char (*) [14])0x3a8ffc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240,
               (char (*) [7])0x3abb91,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_240);
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar10));
    (*pIVar5->_vptr_ImmutableFieldLiteGenerator[4])(pIVar5,printer);
    io::Printer::Print<>(printer,"\n");
    pDVar6 = (this->super_MessageGenerator).descriptor_;
    lVar10 = lVar10 + 0x98;
    field = extraout_RDX_00;
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar2 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    io::Printer::Print<>(printer,"private byte memoizedIsInitialized = 2;\n");
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\n@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\nprotected final java.lang.Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    java.lang.Object arg0, java.lang.Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
             ,(char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"case NEW_BUILDER: {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"return new Builder();\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\ncase BUILD_MESSAGE_INFO: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodNewBuildMessageInfo(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "}\n// fall through\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  com.google.protobuf.Parser<$classname$> parser = PARSER;\n  if (parser == null) {\n    synchronized ($classname$.class) {\n      parser = PARSER;\n      if (parser == null) {\n        parser =\n            new DefaultInstanceBasedParser<$classname$>(\n                DEFAULT_INSTANCE);\n        PARSER = parser;\n      }\n    }\n  }\n  return parser;\n"
             ,(char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Outdent(printer);
  bVar2 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  text = 
  "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return (byte) 1;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  return null;\n}\n"
  ;
  if (bVar2) {
    text = 
    "}\ncase GET_MEMOIZED_IS_INITIALIZED: {\n  return memoizedIsInitialized;\n}\ncase SET_MEMOIZED_IS_INITIALIZED: {\n  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n  return null;\n}\n"
    ;
  }
  io::Printer::Print<>(printer,text);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"  }\n  throw new UnsupportedOperationException();\n}\n\n",
             (char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x3a30d1,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private static final $classname$ DEFAULT_INSTANCE;\n",(char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "static {\n  $classname$ defaultInstance = new $classname$();\n  // New instances are implicitly immutable so no need to make\n  // immutable.\n  DEFAULT_INSTANCE = defaultInstance;\n  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n    $classname$.class, defaultInstance);\n}\n\n"
             ,(char (*) [10])0x3a498c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  bVar2 = IsWrappersProtoFile(*(FileDescriptor **)
                               ((this->super_MessageGenerator).descriptor_ + 0x10));
  if (bVar2) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&messageGenerator,this->name_resolver_,
               (this->super_MessageGenerator).descriptor_);
    type = GetJavaType(*(FieldDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x28));
    local_240.text_ = PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (printer,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x3a498c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator,(char (*) [11])0x3bb088,&local_240.text_);
    std::__cxx11::string::~string((string *)&messageGenerator);
  }
  GenerateParser(this,printer);
  lVar9 = 0;
  for (lVar10 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar10 < *(int *)(pDVar6 + 0x7c); lVar10 = lVar10 + 1) {
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&messageGenerator,
               (FieldDescriptor *)(*(long *)(pDVar6 + 0x50) + lVar9),this->context_);
    ImmutableExtensionLiteGenerator::Generate
              ((ImmutableExtensionLiteGenerator *)&messageGenerator,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&messageGenerator);
    lVar9 = lVar9 + 0x98;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::__cxx11::string::~string((string *)&builder_type);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(descriptor_->nested_type(i),
                                                   context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars, "public enum $oneof_capitalized_name$Case {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$field_name$($field_number$),\n", "field_name",
                     ToUpper(field->name()), "field_number",
                     StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        // TODO(b/135620659): Rename this to "getFieldNumber" or something to
        // disambiguate it from actual proto enums.
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "private void clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n"
                   "}\n"
                   "\n");
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). 0 means false, 1 means true, and all other values
    // mean not yet computed.
    printer->Print("private byte memoizedIsInitialized = 2;\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\n"
      "protected final java.lang.Object dynamicMethod(\n"
      "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
      "    java.lang.Object arg0, java.lang.Object arg1) {\n"
      "  switch (method) {\n"
      "    case NEW_MUTABLE_INSTANCE: {\n"
      "      return new $classname$();\n"
      "    }\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print("case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "case BUILD_MESSAGE_INFO: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuildMessageInfo(printer);
  printer->Outdent();

  printer->Print(
      "}\n"
      "// fall through\n"
      "case GET_DEFAULT_INSTANCE: {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "case GET_PARSER: {\n"
      // Generally one would use the lazy initialization holder pattern for
      // manipulating static fields but that has exceptional cost on Android as
      // it will generate an extra class for every message. Instead, use the
      // double-check locking pattern which works just as well.
      //
      // The "parser" temporary mirrors the "PARSER" field to eliminate a read
      // at the final return statement.
      "  com.google.protobuf.Parser<$classname$> parser = PARSER;\n"
      "  if (parser == null) {\n"
      "    synchronized ($classname$.class) {\n"
      "      parser = PARSER;\n"
      "      if (parser == null) {\n"
      "        parser =\n"
      "            new DefaultInstanceBasedParser<$classname$>(\n"
      "                DEFAULT_INSTANCE);\n"
      "        PARSER = parser;\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return parser;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Outdent();

  if (HasRequiredFields(descriptor_)) {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return memoizedIsInitialized;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  memoizedIsInitialized = (byte) (arg0 == null ? 0 : 1);\n"
        "  return null;\n"
        "}\n");
  } else {
    printer->Print(
        "}\n"
        "case GET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return (byte) 1;\n"
        "}\n"
        "case SET_MEMOIZED_IS_INITIALIZED: {\n"
        "  return null;\n"
        "}\n");
  }

  printer->Outdent();
  printer->Print(
      "  }\n"
      "  throw new UnsupportedOperationException();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "static {\n"
      "  $classname$ defaultInstance = new $classname$();\n"
      "  // New instances are implicitly immutable so no need to make\n"
      "  // immutable.\n"
      "  DEFAULT_INSTANCE = defaultInstance;\n"
      // Register the default instance in a map. This map will be used by
      // experimental runtime to lookup default instance given a class instance
      // without using Java reflection.
      "  com.google.protobuf.GeneratedMessageLite.registerDefaultInstance(\n"
      "    $classname$.class, defaultInstance);\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}